

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O2

bool __thiscall
TPZPlane::Belongs(TPZPlane *this,TPZVec<double> *ponto1,TPZVec<double> *ponto2,
                 TPZVec<double> *ponto3)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char cVar8;
  long lVar9;
  TPZVec<double> aux1;
  TPZVec<double> aux2;
  
  bVar4 = Belongs(this,ponto1);
  bVar5 = Belongs(this,ponto2);
  bVar6 = Belongs(this,ponto3);
  TPZVec<double>::TPZVec(&aux1,3);
  TPZVec<double>::TPZVec(&aux2,3);
  cVar8 = bVar6 + bVar5 + bVar4;
  if (cVar8 == '\x03') {
    pdVar1 = ponto1->fStore;
    pdVar2 = ponto2->fStore;
    pdVar3 = ponto3->fStore;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      aux1.fStore[lVar9] = (pdVar1[lVar9] - pdVar2[lVar9]) * 100.0;
      aux2.fStore[lVar9] = (pdVar2[lVar9] - pdVar3[lVar9]) * 100.0;
    }
    TPZNumeric::ProdVetorial<double>(&aux1,&aux2,&aux1);
    iVar7 = 0;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      iVar7 = iVar7 + (uint)(ABS(aux1.fStore[lVar9]) < 9e-07);
    }
    if (iVar7 == 3) {
      std::operator<<((ostream *)&std::cout,
                      "TPZPlane::Belongs(p1, p2, p3) - Warning: The 3 input points are colinear\n");
    }
  }
  TPZVec<double>::~TPZVec(&aux2);
  TPZVec<double>::~TPZVec(&aux1);
  return cVar8 == '\x03';
}

Assistant:

bool TPZPlane::Belongs(const TPZVec<REAL> &ponto1, const TPZVec<REAL> &ponto2, const TPZVec<REAL> &ponto3){
	int aux=0;
	int i;
	aux = aux + Belongs(ponto1);
	aux = aux + Belongs(ponto2);
	aux = aux + Belongs(ponto3);
	TPZVec<REAL> aux1(3), aux2(3);
    // Verify if the points are colinear
	if(aux==3) {
		for(i=0;i<3;i++) {
			aux1[i]=100.*(ponto1[i]-ponto2[i]);
			aux2[i]=100.*(ponto2[i]-ponto3[i]);
		}
		// Verify if the displacement vectors have the same direction
		aux=0;
		TPZNumeric::ProdVetorial(aux1, aux2, aux1);
		for(i=0;i<3;i++) {
			if(fabs(aux1[i])<0.0000009) aux++;
		}
		if(aux==3) {
			cout << "TPZPlane::Belongs(p1, p2, p3) - Warning: The 3 input points are colinear\n";
		}
		return true;
	}
	else return false;
}